

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O2

bool __thiscall
QSharedMemoryPosix::create(QSharedMemoryPosix *this,QSharedMemoryPrivate *self,qsizetype size)

{
  bool bVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  char *__name;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QArrayDataPointer<char16_t> QStack_88;
  QLatin1String local_70;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = handle(this,self);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_0043b553;
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_60.d = (self->nativeKey).key.d.d;
  local_60.ptr = (self->nativeKey).key.d.ptr;
  local_60.size = (self->nativeKey).key.d.size;
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toLocal8Bit((QByteArray *)&local_48,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  do {
    __name = local_48.ptr;
    if (local_48.ptr == (char *)0x0) {
      __name = &QByteArray::_empty;
    }
    __fd = shm_open(__name,0x800c2,0x180);
    if (__fd != -1) goto LAB_0043b4fc;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_70.m_size = 0x20;
  local_70.m_data = "QSharedMemory::attach (shm_open)";
  if (*piVar3 == 0x16) {
    QSharedMemory::tr((QString *)&QStack_88,"%1: bad name",(char *)0x0,-1);
    QString::arg<QLatin1String,_true>
              ((QString *)&local_60,(QString *)&QStack_88,&local_70,0,(QChar)0x20);
    self->error = KeyError;
    QString::operator=(&self->errorString,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
  }
  else {
    function_00.m_data = "QSharedMemory::attach (shm_open)";
    function_00.m_size = 0x20;
    QSharedMemoryPrivate::setUnixErrorString(self,function_00);
  }
  goto LAB_0043b547;
  while( true ) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) break;
LAB_0043b4fc:
    iVar2 = ftruncate64(__fd,size);
    if (iVar2 != -1) {
      bVar1 = true;
      qt_safe_close(__fd);
      goto LAB_0043b549;
    }
  }
  function.m_data = "QSharedMemory::create (ftruncate)";
  function.m_size = 0x21;
  QSharedMemoryPrivate::setUnixErrorString(self,function);
  qt_safe_close(__fd);
LAB_0043b547:
  bVar1 = false;
LAB_0043b549:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
LAB_0043b553:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemoryPosix::create(QSharedMemoryPrivate *self, qsizetype size)
{
    if (!handle(self))
        return false;

    const QByteArray shmName = QFile::encodeName(self->nativeKey.nativeKey());

    int fd;
    QT_EINTR_LOOP(fd, ::shm_open(shmName.constData(), O_RDWR | O_CREAT | O_EXCL | O_CLOEXEC, 0600));
    if (fd == -1) {
        const int errorNumber = errno;
        const auto function = "QSharedMemory::attach (shm_open)"_L1;
        switch (errorNumber) {
        case EINVAL:
            self->setError(QSharedMemory::KeyError,
                           QSharedMemory::tr("%1: bad name").arg(function));
            break;
        default:
            self->setUnixErrorString(function);
        }
        return false;
    }

    // the size may only be set once
    int ret;
    QT_EINTR_LOOP(ret, QT_FTRUNCATE(fd, size));
    if (ret == -1) {
        self->setUnixErrorString("QSharedMemory::create (ftruncate)"_L1);
        qt_safe_close(fd);
        return false;
    }

    qt_safe_close(fd);

    return true;
}